

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_r.c
# Opt level: O0

void test_option_r(void)

{
  char *buff_00;
  wchar_t wVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  int local_40;
  int i;
  int r;
  size_t buff_size_rounded;
  size_t s;
  size_t buff_size;
  char *p1;
  char *p0;
  char *buff;
  
  s = 35000;
  p0 = (char *)0x0;
  p1 = (char *)0x0;
  buff_size = 0;
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                      ,L'\x19',"f1",L'Ƥ',L'\xffffffff',"abc");
  wVar1 = systemf("%s cf archive.tar --format=ustar f1 >step1.out 2>step1.err",testprog);
  failure("Error invoking %s cf archive.tar f1",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                      ,L'\x1c',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
             ,L'\x1d',"step1.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
             ,L'\x1e',"step1.err");
  p1 = slurpfile(&buff_size_rounded,"archive.tar");
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                           ,L'\"',(uint)(p1 != (char *)0x0),"p0 != NULL",(void *)0x0);
  if ((wVar1 != L'\0') &&
     (wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                               ,L'$',(uint)(0x7ff < buff_size_rounded),"s >= 2048",(void *)0x0),
     wVar1 != L'\0')) {
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                        ,L'&',p1,"p0 + 0","f1","\"f1\"",3,"3",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                        ,L'\'',p1 + 0x200,"p0 + 512","abc","\"abc\"",3,"3",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                        ,L'(',p1 + 0x400,"p0 + 1024","","\"\\0\\0\\0\\0\\0\\0\\0\\0\"",8,"8",
                        (void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                        ,L')',p1 + 0x600,"p0 + 1536","","\"\\0\\0\\0\\0\\0\\0\\0\\0\"",8,"8",
                        (void *)0x0);
    p0 = (char *)malloc(s);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                     ,L'-',(uint)(p0 != (char *)0x0),"buff != NULL",(void *)0x0);
    if (p0 != (char *)0x0) {
      for (local_40 = 0; local_40 < (int)s; local_40 = local_40 + 1) {
        iVar2 = rand();
        p0[local_40] = "abcdefghijklmnopqrstuvwxyz"[iVar2 % 0x1a];
      }
      p0[s - 1] = '\0';
      assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                          ,L'4',"f1",L'Ƥ',L'\xffffffff',p0);
      wVar1 = systemf("%s rf archive.tar --format=ustar f1 >step2.out 2>step2.err",testprog);
      failure("Error invoking %s rf archive.tar f1",testprog);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                          ,L'7',(long)wVar1,"r",0,"0",(void *)0x0);
      assertion_empty_file
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                 ,L'8',"step2.out");
      assertion_empty_file
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                 ,L'9',"step2.err");
      buff_size = (size_t)slurpfile(&buff_size_rounded,"archive.tar");
      wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                               ,L'=',(uint)((char *)buff_size != (char *)0x0),"p1 != NULL",
                               (void *)0x0);
      if (wVar1 != L'\0') {
        uVar3 = s + 0x1ff & 0xfffffffffffffe00;
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                         ,L'@',(uint)(uVar3 + 0xa00 <= buff_size_rounded),
                         "s >= 2560 + buff_size_rounded",(void *)0x0);
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                            ,L'B',p1,"p0",(void *)buff_size,"p1",0x400,"1024",(void *)0x0);
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                            ,L'D',(void *)(buff_size + 0x400),"p1 + 1024","f1","\"f1\"",3,"3",
                            (void *)0x0);
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                            ,L'E',(void *)(buff_size + 0x600),"p1 + 1536",p0,"buff",s,"buff_size",
                            (void *)0x0);
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                            ,L'G',(void *)(buff_size + 0x600 + uVar3),
                            "p1 + 1536 + buff_size_rounded","","\"\\0\\0\\0\\0\\0\\0\\0\\0\"",8,"8",
                            (void *)0x0);
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                            ,L'H',(void *)(buff_size + 0x800 + uVar3),
                            "p1 + 2048 + buff_size_rounded","","\"\\0\\0\\0\\0\\0\\0\\0\\0\"",8,"8",
                            (void *)0x0);
        free(p1);
        p1 = (char *)buff_size;
        assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                            ,L'N',"f2",L'Ƥ',L'\xffffffff',"f2");
        wVar1 = systemf("%s rf archive.tar --format=ustar f2 >step3.out 2>step3.err",testprog);
        failure("Error invoking %s rf archive.tar f2",testprog);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                            ,L'Q',(long)wVar1,"r",0,"0",(void *)0x0);
        assertion_empty_file
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                   ,L'R',"step3.out");
        assertion_empty_file
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                   ,L'S',"step3.err");
        buff_size = (size_t)slurpfile(&buff_size_rounded,"archive.tar");
        wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                                 ,L'W',(uint)((char *)buff_size != (char *)0x0),"p1 != NULL",
                                 (void *)0x0);
        if (wVar1 != L'\0') {
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                           ,L'Y',(uint)(uVar3 + 0xe00 <= buff_size_rounded),
                           "s >= 3584 + buff_size_rounded",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                              ,L'[',p1,"p0",(void *)buff_size,"p1",uVar3 + 0x600,
                              "1536 + buff_size_rounded",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                              ,L']',(void *)(buff_size + 0x600 + uVar3),
                              "p1 + 1536 + buff_size_rounded","f2","\"f2\"",3,"3",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                              ,L'^',(void *)(buff_size + 0x800 + uVar3),
                              "p1 + 2048 + buff_size_rounded","f2","\"f2\"",3,"3",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                              ,L'`',(void *)(buff_size + 0xa00 + uVar3),
                              "p1 + 2560 + buff_size_rounded","","\"\\0\\0\\0\\0\\0\\0\\0\\0\"",8,
                              "8",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                              ,L'a',(void *)(buff_size + 0xc00 + uVar3),
                              "p1 + 3072 + buff_size_rounded","","\"\\0\\0\\0\\0\\0\\0\\0\\0\"",8,
                              "8",(void *)0x0);
          free((void *)buff_size);
          assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                             ,L'e',"extract",L'ǽ');
          assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                          ,L'f',"extract");
          wVar1 = systemf("%s xf ../archive.tar >extract.out 2>extract.err",testprog);
          failure("Error invoking %s xf archive.tar",testprog);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                              ,L'i',(long)wVar1,"r",0,"0",(void *)0x0);
          assertion_empty_file
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                     ,L'j',"extract.out");
          assertion_empty_file
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                     ,L'k',"extract.err");
          buff_00 = p0;
          sVar4 = strlen(p0);
          assertion_file_contents
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_r.c"
                     ,L'n',buff_00,(wchar_t)sVar4,"f1");
        }
      }
    }
  }
  free(p0);
  free(p1);
  return;
}

Assistant:

DEFINE_TEST(test_option_r)
{
	char *buff;
	char *p0, *p1;
	size_t buff_size = 35000;
	size_t s, buff_size_rounded;
	int r, i;

	buff = NULL;
	p0 = NULL;
	p1 = NULL;

	/* Create an archive with one file. */
	assertMakeFile("f1", 0644, "abc");
	r = systemf("%s cf archive.tar --format=ustar f1 >step1.out 2>step1.err", testprog);
	failure("Error invoking %s cf archive.tar f1", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("step1.out");
	assertEmptyFile("step1.err");

	/* Do some basic validation of the constructed archive. */
	p0 = slurpfile(&s, "archive.tar");
	if (!assert(p0 != NULL))
		goto done;
	if (!assert(s >= 2048))
		goto done;
	assertEqualMem(p0 + 0, "f1", 3);
	assertEqualMem(p0 + 512, "abc", 3);
	assertEqualMem(p0 + 1024, "\0\0\0\0\0\0\0\0", 8);
	assertEqualMem(p0 + 1536, "\0\0\0\0\0\0\0\0", 8);

	/* Edit that file with a lot more data and update the archive with a new copy. */
	buff = malloc(buff_size);
	assert(buff != NULL);
	if (buff == NULL)
		goto done;

	for (i = 0; i < (int)buff_size; ++i)
		buff[i] = "abcdefghijklmnopqrstuvwxyz"[rand() % 26];
	buff[buff_size - 1] = '\0';
	assertMakeFile("f1", 0644, buff);
	r = systemf("%s rf archive.tar --format=ustar f1 >step2.out 2>step2.err", testprog);
	failure("Error invoking %s rf archive.tar f1", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("step2.out");
	assertEmptyFile("step2.err");

	/* The constructed archive should just have the new entry appended. */
	p1 = slurpfile(&s, "archive.tar");
	if (!assert(p1 != NULL))
		goto done;
	buff_size_rounded = ((buff_size + 511) / 512) * 512;
	assert(s >= 2560 + buff_size_rounded);
	/* Verify first entry is unchanged. */
	assertEqualMem(p0, p1, 1024);
	/* Verify that second entry is correct. */
	assertEqualMem(p1 + 1024, "f1", 3);
	assertEqualMem(p1 + 1536, buff, buff_size);
	/* Verify end-of-archive marker. */
	assertEqualMem(p1 + 1536 + buff_size_rounded, "\0\0\0\0\0\0\0\0", 8);
	assertEqualMem(p1 + 2048 + buff_size_rounded, "\0\0\0\0\0\0\0\0", 8);

	free(p0);
	p0 = p1;

	/* Update the archive by adding a different file. */
	assertMakeFile("f2", 0644, "f2");
	r = systemf("%s rf archive.tar --format=ustar f2 >step3.out 2>step3.err", testprog);
	failure("Error invoking %s rf archive.tar f2", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("step3.out");
	assertEmptyFile("step3.err");

	/* Validate the constructed archive. */
	p1 = slurpfile(&s, "archive.tar");
	if (!assert(p1 != NULL))
		goto done;
	assert(s >= 3584 + buff_size_rounded);
	/* Verify first two entries are unchanged. */
	assertEqualMem(p0, p1, 1536 + buff_size_rounded);
	/* Verify that new entry is correct. */
	assertEqualMem(p1 + 1536 + buff_size_rounded, "f2", 3);
	assertEqualMem(p1 + 2048 + buff_size_rounded, "f2", 3);
	/* Verify end-of-archive marker. */
	assertEqualMem(p1 + 2560 + buff_size_rounded, "\0\0\0\0\0\0\0\0", 8);
	assertEqualMem(p1 + 3072 + buff_size_rounded, "\0\0\0\0\0\0\0\0", 8);
	free(p1);

	/* Unpack everything */
	assertMakeDir("extract", 0775);
	assertChdir("extract");
	r = systemf("%s xf ../archive.tar >extract.out 2>extract.err", testprog);
	failure("Error invoking %s xf archive.tar", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("extract.out");
	assertEmptyFile("extract.err");

	/* Verify that the second copy of f1 overwrote the first. */
	assertFileContents(buff, (int)strlen(buff), "f1");
done:
	free(buff);
	free(p0);
}